

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseStringLiteralTest_Test::
~OpenDDLParserTest_parseStringLiteralTest_Test(OpenDDLParserTest_parseStringLiteralTest_Test *this)

{
  OpenDDLParserTest_parseStringLiteralTest_Test *this_local;
  
  ~OpenDDLParserTest_parseStringLiteralTest_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseStringLiteralTest) {
    size_t len1(0);
    Value *data(nullptr);
    char token1[] = "\"teststring\"", *end1(findEnd(token1, len1));
    char *in(token1);

    char *out = OpenDDLParser::parseStringLiteral(token1, end1, &data);
    EXPECT_NE(in, out);
    EXPECT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_string, data->m_type);
    std::string str((char *)data->m_data);
    int res(::strncmp("teststring", str.c_str(), str.size()));
    EXPECT_EQ(0, res);
    registerValueForDeletion(data);
}